

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_pass(REF_GRID ref_grid)

{
  REF_STATUS RVar1;
  uint uVar2;
  int local_170;
  byte local_169;
  int local_168;
  int local_164;
  int local_160;
  bool local_159;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_INT nodes [27];
  int local_c0;
  int local_bc;
  REF_INT cell_node;
  REF_INT cell;
  REF_DBL min_quality;
  REF_DBL quality;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL vol_val;
  REF_BOOL interior;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_BOOL allowed;
  REF_INT node;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GRID ref_grid_local;
  
  ref_geom = (REF_GEOM)ref_grid->node;
  _node = ref_grid->geom;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    ref_node = (REF_NODE)ref_grid->cell[8];
  }
  else {
    ref_node = (REF_NODE)ref_grid->cell[3];
  }
  ref_private_macro_code_rss_1 = 0;
  ref_cell = (REF_CELL)ref_grid;
  for (allowed = 0; allowed < _node->max; allowed = allowed + 1) {
    if (_node->descr[allowed * 6] == 1) {
      geom_node = _node->descr[allowed * 6 + 5];
      ref_private_macro_code_rss_3 = ref_geom_is_a(_node,geom_node,0,&geom_face);
      if (ref_private_macro_code_rss_3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x72f,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_3,"node check");
        return ref_private_macro_code_rss_3;
      }
      if (geom_face == 0) {
        ref_private_macro_code_rss_4 =
             ref_smooth_local_cell_about((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge)
        ;
        if (ref_private_macro_code_rss_4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x733,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_4,"para");
          return ref_private_macro_code_rss_4;
        }
        if (geom_edge == 0) {
          *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
               *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
        }
        else {
          if (_node->meshlink == (void *)0x0) {
            ref_private_macro_code_rss_6 = ref_smooth_geom_edge((REF_GRID)ref_cell,geom_node);
            if (ref_private_macro_code_rss_6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x73b,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_6,
                     "ideal node for edge");
              return ref_private_macro_code_rss_6;
            }
            ref_private_macro_code_rss_6 = 0;
          }
          else {
            ref_private_macro_code_rss_5 =
                 ref_smooth_meshlink_edge_improve((REF_GRID)ref_cell,geom_node);
            if (ref_private_macro_code_rss_5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x739,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_5,"improve");
              return ref_private_macro_code_rss_5;
            }
            ref_private_macro_code_rss_5 = 0;
          }
          *(undefined4 *)((long)ref_geom->face_min_length + (long)geom_node * 4) = 0;
        }
      }
    }
  }
  if (ref_private_macro_code_rss_1 != 0) {
    ref_private_macro_code_rss_7 = ref_validation_cell_volume((REF_GRID)ref_cell);
    if (ref_private_macro_code_rss_7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x740,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_7,"vol geom edge");
      return ref_private_macro_code_rss_7;
    }
    ref_private_macro_code_rss_7 = 0;
  }
  for (geom_node = 0; geom_node < ref_geom->max; geom_node = geom_node + 1) {
    if (((-1 < geom_node) && (geom_node < ref_geom->max)) &&
       (-1 < *(long *)(ref_geom->descr + (long)geom_node * 2))) {
      if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell->edge_per + 0x40) <= geom_node)) {
        local_14c = -1;
      }
      else {
        local_14c = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell->edge_per + 0x40) + 8) +
                            (long)geom_node * 4);
      }
      geom_edge = (REF_BOOL)(local_14c != -1);
      if (geom_edge != 0) {
        ref_private_macro_code_rss_8 = ref_geom_is_a(_node,geom_node,1,&interior);
        if (ref_private_macro_code_rss_8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x747,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_8,"edge check");
          return ref_private_macro_code_rss_8;
        }
        if (interior == 0) {
          ref_private_macro_code_rss_9 =
               ref_smooth_local_cell_about
                         ((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge);
          if (ref_private_macro_code_rss_9 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x74b,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_9,"para");
            return ref_private_macro_code_rss_9;
          }
          if (geom_edge == 0) {
            *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
                 *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
          }
          else {
            *(undefined4 *)((long)ref_geom->face_min_length + (long)geom_node * 4) = 0;
            ref_private_macro_code_rss_10 =
                 ref_smooth_no_geom_edge_improve((REF_GRID)ref_cell,geom_node);
            if (ref_private_macro_code_rss_10 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x752,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_10,"improve");
              return ref_private_macro_code_rss_10;
            }
            ref_private_macro_code_rss_10 = 0;
          }
        }
      }
    }
  }
  if (ref_private_macro_code_rss_1 != 0) {
    ref_private_macro_code_rss_11 = ref_validation_cell_volume((REF_GRID)ref_cell);
    if (ref_private_macro_code_rss_11 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x755,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_11,"vol nogeom edge");
      return ref_private_macro_code_rss_11;
    }
    ref_private_macro_code_rss_11 = 0;
  }
  if (0 < ref_cell[2].e2n[0x1f]) {
    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_cell,"mov edge");
  }
  for (allowed = 0; allowed < _node->max; allowed = allowed + 1) {
    if (_node->descr[allowed * 6] == 2) {
      geom_node = _node->descr[allowed * 6 + 5];
      ref_private_macro_code_rss_12 = ref_geom_is_a(_node,geom_node,1,&interior);
      if (ref_private_macro_code_rss_12 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x75e,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_12,"edge check");
        return ref_private_macro_code_rss_12;
      }
      if (interior == 0) {
        ref_private_macro_code_rss_13 =
             ref_smooth_local_cell_about((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge)
        ;
        if (ref_private_macro_code_rss_13 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x762,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_13,"para");
          return ref_private_macro_code_rss_13;
        }
        if (geom_edge == 0) {
          *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
               *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
        }
        else {
          if (_node->meshlink == (void *)0x0) {
            ref_private_macro_code_rss_15 = ref_smooth_geom_face((REF_GRID)ref_cell,geom_node);
            if (ref_private_macro_code_rss_15 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x76a,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_15,
                     "ideal node for face");
              return ref_private_macro_code_rss_15;
            }
            ref_private_macro_code_rss_15 = 0;
          }
          else {
            ref_private_macro_code_rss_14 =
                 ref_smooth_meshlink_face_improve((REF_GRID)ref_cell,geom_node);
            if (ref_private_macro_code_rss_14 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x768,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_14,"improve");
              return ref_private_macro_code_rss_14;
            }
            ref_private_macro_code_rss_14 = 0;
          }
          *(undefined4 *)((long)ref_geom->face_min_length + (long)geom_node * 4) = 0;
        }
      }
    }
  }
  if (ref_private_macro_code_rss_1 != 0) {
    ref_private_macro_code_rss_16 = ref_validation_cell_volume((REF_GRID)ref_cell);
    if (ref_private_macro_code_rss_16 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x76f,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_16,"vol face geom");
      return ref_private_macro_code_rss_16;
    }
    ref_private_macro_code_rss_16 = 0;
  }
  for (geom_node = 0; geom_node < ref_geom->max; geom_node = geom_node + 1) {
    if (((-1 < geom_node) && (geom_node < ref_geom->max)) &&
       (-1 < *(long *)(ref_geom->descr + (long)geom_node * 2))) {
      if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell->edge_per + 0x40) <= geom_node)) {
        local_150 = -1;
      }
      else {
        local_150 = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell->edge_per + 0x40) + 8) +
                            (long)geom_node * 4);
      }
      if (local_150 == -1) {
        if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell->n + 0x40) <= geom_node)) {
          local_154 = -1;
        }
        else {
          local_154 = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell->n + 0x40) + 8) +
                              (long)geom_node * 4);
        }
        geom_edge = (REF_BOOL)(local_154 != -1);
        if (geom_edge != 0) {
          ref_private_macro_code_rss_17 = ref_geom_is_a(_node,geom_node,2,&vol_val);
          if (ref_private_macro_code_rss_17 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x77a,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_17,"face check")
            ;
            return ref_private_macro_code_rss_17;
          }
          if (vol_val == 0) {
            ref_private_macro_code_rss_18 =
                 ref_smooth_local_cell_about
                           ((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge);
            if (ref_private_macro_code_rss_18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x77e,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_18,"para");
              return ref_private_macro_code_rss_18;
            }
            if (geom_edge == 0) {
              *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
                   *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
            }
            else {
              ref_private_macro_code_rss_19 =
                   ref_smooth_no_geom_tri_improve((REF_GRID)ref_cell,geom_node);
              if (ref_private_macro_code_rss_19 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x783,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_19,
                       "no geom smooth");
                return ref_private_macro_code_rss_19;
              }
              ref_private_macro_code_rss_19 = 0;
            }
          }
        }
      }
      else {
        geom_edge = 0;
      }
    }
  }
  if (ref_private_macro_code_rss_1 != 0) {
    ref_private_macro_code_rss_20 = ref_validation_cell_volume((REF_GRID)ref_cell);
    if (ref_private_macro_code_rss_20 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x786,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_20,"vol face nogeom");
      return ref_private_macro_code_rss_20;
    }
    ref_private_macro_code_rss_20 = 0;
  }
  if (0 < ref_cell[2].e2n[0x1f]) {
    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_cell,"mov face");
  }
  ref_node = *(REF_NODE *)&ref_cell[1].size_per;
  for (geom_node = 0; geom_node < ref_geom->max; geom_node = geom_node + 1) {
    if (((-1 < geom_node) && (geom_node < ref_geom->max)) &&
       (-1 < *(long *)(ref_geom->descr + (long)geom_node * 2))) {
      ref_private_macro_code_rss_21 =
           ref_smooth_local_cell_about((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge);
      if (ref_private_macro_code_rss_21 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x790,"ref_smooth_pass",(ulong)(uint)ref_private_macro_code_rss_21,"para");
        return ref_private_macro_code_rss_21;
      }
      if (geom_edge == 0) {
        *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
             *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
      }
      else {
        if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell->n + 0x40) <= geom_node)) {
          local_158 = -1;
        }
        else {
          local_158 = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell->n + 0x40) + 8) +
                              (long)geom_node * 4);
        }
        local_159 = false;
        if (local_158 == -1) {
          if ((geom_node < 0) || (**(int **)(ref_cell->ref_adj + 2) <= geom_node)) {
            local_160 = -1;
          }
          else {
            local_160 = *(int *)(*(long *)(*(long *)(ref_cell->ref_adj + 2) + 8) +
                                (long)geom_node * 4);
          }
          local_159 = false;
          if (local_160 == -1) {
            if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell[1].size_per + 0x40) <= geom_node))
            {
              local_164 = -1;
            }
            else {
              local_164 = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell[1].size_per + 0x40) + 8) +
                                  (long)geom_node * 4);
            }
            local_159 = local_164 != -1;
          }
        }
        ref_private_macro_code_rss = (REF_STATUS)local_159;
        if (ref_private_macro_code_rss != 0) {
          quality._4_4_ = ref_smooth_tet_improve((REF_GRID)ref_cell,geom_node);
          if (quality._4_4_ != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x79a,"ref_smooth_pass",(ulong)quality._4_4_,"ideal tet node");
            return quality._4_4_;
          }
          *(undefined4 *)((long)ref_geom->face_min_length + (long)geom_node * 4) = 0;
          quality._4_4_ = 0;
        }
      }
    }
  }
  if (ref_private_macro_code_rss_1 != 0) {
    quality._0_4_ = ref_validation_cell_volume((REF_GRID)ref_cell);
    if (quality._0_4_ != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x79f,"ref_smooth_pass",(ulong)quality._0_4_,"vol int");
      return quality._0_4_;
    }
    quality._0_4_ = 0;
  }
  if (0 < ref_cell[2].e2n[0x1f]) {
    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_cell,"mov int");
  }
  ref_node = *(REF_NODE *)&ref_cell[1].size_per;
  if (*(int *)&ref_cell[3].field_0x34 == 0) {
    for (local_bc = 0; local_bc < *(int *)((long)&ref_node->part + 4); local_bc = local_bc + 1) {
      RVar1 = ref_cell_nodes((REF_CELL)ref_node,local_bc,&ref_private_macro_code_rss_23);
      if (RVar1 == 0) {
        uVar2 = ref_node_tet_quality((REF_NODE)ref_geom,&ref_private_macro_code_rss_23,&min_quality)
        ;
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x7ab,"ref_smooth_pass",(ulong)uVar2,"qual");
          return uVar2;
        }
        if (min_quality < 0.1) {
          for (local_c0 = 0; local_c0 < *(int *)&ref_node->field_0xc; local_c0 = local_c0 + 1) {
            geom_node = (&ref_private_macro_code_rss_23)[local_c0];
            uVar2 = ref_smooth_local_cell_about
                              ((REF_CELL)ref_node,(REF_NODE)ref_geom,geom_node,&geom_edge);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x7b0,"ref_smooth_pass",(ulong)uVar2,"para");
              return uVar2;
            }
            if (geom_edge == 0) {
              *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) =
                   *(int *)((long)ref_geom->face_min_length + (long)geom_node * 4) + 1;
            }
            else {
              if ((geom_node < 0) || (**(int **)(*(long *)&ref_cell->n + 0x40) <= geom_node)) {
                local_168 = -1;
              }
              else {
                local_168 = *(int *)(*(long *)(*(long *)(*(long *)&ref_cell->n + 0x40) + 8) +
                                    (long)geom_node * 4);
              }
              local_169 = 0;
              if (local_168 == -1) {
                if ((geom_node < 0) || (**(int **)(ref_cell->ref_adj + 2) <= geom_node)) {
                  local_170 = -1;
                }
                else {
                  local_170 = *(int *)(*(long *)(*(long *)(ref_cell->ref_adj + 2) + 8) +
                                      (long)geom_node * 4);
                }
                local_169 = local_170 != -1 ^ 0xff;
              }
              ref_private_macro_code_rss = (uint)(local_169 & 1);
              if ((local_169 & 1) != 0) {
                uVar2 = ref_smooth_tet_improve((REF_GRID)ref_cell,geom_node);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                         ,0x7b9,"ref_smooth_pass",(ulong)uVar2,"ideal");
                  return uVar2;
                }
                *(undefined4 *)((long)ref_geom->face_min_length + (long)geom_node * 4) = 0;
              }
            }
          }
        }
      }
    }
    if ((ref_private_macro_code_rss_1 != 0) &&
       (uVar2 = ref_validation_cell_volume((REF_GRID)ref_cell), uVar2 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x7bf,"ref_smooth_pass",(ulong)uVar2,"vol about");
      return uVar2;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_pass(REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node;
  REF_BOOL allowed, geom_node, geom_edge, geom_face, interior;
  REF_BOOL vol_val = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol start");

  /* smooth edges first if we have geom */
  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node check");
    if (geom_node) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_edge_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_edge(ref_grid, node), "ideal node for edge");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol geom edge");

  /* smooth edges first without geom, for 2D */
  each_ref_node_valid_node(ref_node, node) {
    /* boundaries only */
    allowed = !ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    ref_node_age(ref_node, node) = 0;
    RSS(ref_smooth_no_geom_edge_improve(ref_grid, node), "improve");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol nogeom edge");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov edge");

  /* smooth faces if we have geom, but skip edges */
  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    /* don't move geom nodes */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge check");
    if (geom_edge) continue;
    /* next to ghost node, can't move */
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    if (ref_geom_meshlinked(ref_geom)) {
      RSS(ref_smooth_meshlink_face_improve(ref_grid, node), "improve");
    } else {
      RSS(ref_smooth_geom_face(ref_grid, node), "ideal node for face");
    }
    ref_node_age(ref_node, node) = 0;
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face geom");

  /* smooth faces without geom */
  each_ref_node_valid_node(ref_node, node) {
    /* avoid edges */
    allowed = ref_cell_node_empty(ref_grid_edg(ref_grid), node);
    if (!allowed) continue;
    /* need tri to smooth */
    allowed = !ref_cell_node_empty(ref_grid_tri(ref_grid), node);
    if (!allowed) continue;
    /* avoid geometry faces (or edges) */
    RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face check");
    if (geom_face) continue;

    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }
    RSS(ref_smooth_no_geom_tri_improve(ref_grid, node), "no geom smooth");
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol face nogeom");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov face");

  /* smooth interior */
  ref_cell = ref_grid_tet(ref_grid);

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
        "para");
    if (!allowed) {
      ref_node_age(ref_node, node)++;
      continue;
    }

    interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
               ref_cell_node_empty(ref_grid_qua(ref_grid), node) &&
               !ref_cell_node_empty(ref_grid_tet(ref_grid), node);
    if (interior) {
      RSS(ref_smooth_tet_improve(ref_grid, node), "ideal tet node");
      ref_node_age(ref_node, node) = 0;
    }
  }

  if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol int");

  if (ref_grid_adapt(ref_grid, timing_level) > 0)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "mov int");

  /* smooth low quality tets */
  ref_cell = ref_grid_tet(ref_grid);

  if (!ref_grid_surf(ref_grid)) {
    REF_DBL quality, min_quality = 0.10;
    REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      RSS(ref_node_tet_quality(ref_node, nodes, &quality), "qual");
      if (quality < min_quality) {
        each_ref_cell_cell_node(ref_cell, cell_node) {
          node = nodes[cell_node];
          RSS(ref_smooth_local_cell_about(ref_cell, ref_node, node, &allowed),
              "para");
          if (!allowed) {
            ref_node_age(ref_node, node)++;
            continue;
          }

          interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                     ref_cell_node_empty(ref_grid_qua(ref_grid), node);
          if (interior) {
            RSS(ref_smooth_tet_improve(ref_grid, node), "ideal");
            ref_node_age(ref_node, node) = 0;
          }
        }
      }
    }
    if (vol_val) RSS(ref_validation_cell_volume(ref_grid), "vol about");
  }
  return REF_SUCCESS;
}